

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

void Curl_pollset_change(Curl_easy *data,easy_pollset *ps,curl_socket_t sock,int add_flags,
                        int remove_flags)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  
  if (-1 < sock) {
    uVar1 = ps->num;
    if (uVar1 == 0) {
      uVar1 = 0;
    }
    else {
      lVar3 = 0;
      do {
        if (ps->sockets[lVar3] == sock) {
          bVar2 = (byte)add_flags | ~(byte)remove_flags & ps->actions[lVar3];
          ps->actions[lVar3] = bVar2;
          if (bVar2 != 0) {
            return;
          }
          if ((uint)lVar3 + 1 < uVar1) {
            uVar4 = ~(uint)lVar3;
            memmove(ps->sockets + lVar3,ps->sockets + lVar3 + 1,(ulong)(uVar4 + uVar1) << 2);
            memmove(ps->actions + lVar3,ps->actions + lVar3 + 1,(ulong)(uVar4 + ps->num));
          }
          ps->num = ps->num - 1;
          return;
        }
        lVar3 = lVar3 + 1;
      } while (uVar1 != (uint)lVar3);
    }
    if (uVar1 < 5 && add_flags != 0) {
      ps->sockets[uVar1] = sock;
      ps->actions[uVar1] = (byte)add_flags;
      ps->num = uVar1 + 1;
    }
  }
  return;
}

Assistant:

void Curl_pollset_change(struct Curl_easy *data,
                       struct easy_pollset *ps, curl_socket_t sock,
                       int add_flags, int remove_flags)
{
  unsigned int i;

  (void)data;
  DEBUGASSERT(VALID_SOCK(sock));
  if(!VALID_SOCK(sock))
    return;

  DEBUGASSERT(add_flags <= (CURL_POLL_IN|CURL_POLL_OUT));
  DEBUGASSERT(remove_flags <= (CURL_POLL_IN|CURL_POLL_OUT));
  DEBUGASSERT((add_flags&remove_flags) == 0); /* no overlap */
  for(i = 0; i < ps->num; ++i) {
    if(ps->sockets[i] == sock) {
      ps->actions[i] &= (unsigned char)(~remove_flags);
      ps->actions[i] |= (unsigned char)add_flags;
      /* all gone? remove socket */
      if(!ps->actions[i]) {
        if((i + 1) < ps->num) {
          memmove(&ps->sockets[i], &ps->sockets[i + 1],
                  (ps->num - (i + 1)) * sizeof(ps->sockets[0]));
          memmove(&ps->actions[i], &ps->actions[i + 1],
                  (ps->num - (i + 1)) * sizeof(ps->actions[0]));
        }
        --ps->num;
      }
      return;
    }
  }
  /* not present */
  if(add_flags) {
    /* Having more SOCKETS per easy handle than what is defined
     * is a programming error. This indicates that we need
     * to raise this limit, making easy_pollset larger.
     * Since we use this in tight loops, we do not want to make
     * the pollset dynamic unnecessarily.
     * The current maximum in practise is HTTP/3 eyeballing where
     * we have up to 4 sockets involved in connection setup.
     */
    DEBUGASSERT(i < MAX_SOCKSPEREASYHANDLE);
    if(i < MAX_SOCKSPEREASYHANDLE) {
      ps->sockets[i] = sock;
      ps->actions[i] = (unsigned char)add_flags;
      ps->num = i + 1;
    }
  }
}